

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFEmbeddedFontWriter.cpp
# Opt level: O0

EStatusCode __thiscall
CFFEmbeddedFontWriter::AddDependentGlyphs(CFFEmbeddedFontWriter *this,UIntVector *ioSubsetGlyphIDs)

{
  bool bVar1;
  reference puVar2;
  reference __x;
  iterator __first;
  iterator __last;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar3;
  _Self local_b8;
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_98;
  uint *local_90;
  _Rb_tree_const_iterator<unsigned_int> local_88;
  iterator itNewGlyphs;
  bool local_69;
  iterator iStack_68;
  bool localHasCompositeGlyphs;
  byte local_59;
  iterator iStack_58;
  bool hasCompositeGlyphs;
  iterator it;
  UIntSet glyphsSet;
  EStatusCode status;
  UIntVector *ioSubsetGlyphIDs_local;
  CFFEmbeddedFontWriter *this_local;
  
  glyphsSet._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = eSuccess;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&it);
  iStack_58 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(ioSubsetGlyphIDs);
  local_59 = 0;
  while( true ) {
    iStack_68 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(ioSubsetGlyphIDs);
    bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffa8,&stack0xffffffffffffff98);
    if (!bVar1 || glyphsSet._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != eSuccess)
    break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&stack0xffffffffffffffa8);
    glyphsSet._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         AddComponentGlyphs(this,*puVar2,(UIntSet *)&it,&local_69);
    local_59 = (local_59 & 1) != 0 || (local_69 & 1U) != 0;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&stack0xffffffffffffffa8);
  }
  if ((local_59 & 1) != 0) {
    std::_Rb_tree_const_iterator<unsigned_int>::_Rb_tree_const_iterator(&local_88);
    local_90 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 (ioSubsetGlyphIDs);
    iStack_58 = (iterator)local_90;
    while( true ) {
      local_98._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(ioSubsetGlyphIDs);
      bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffa8,&local_98);
      if (!bVar1) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&stack0xffffffffffffffa8);
      pVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&it,puVar2);
      local_a8 = (_Base_ptr)pVar3.first._M_node;
      local_a0 = pVar3.second;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&stack0xffffffffffffffa8);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(ioSubsetGlyphIDs);
    local_b0 = (_Base_ptr)
               std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                         ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&it);
    local_88._M_node = local_b0;
    while( true ) {
      local_b8._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                     ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &it);
      bVar1 = std::operator!=(&local_88,&local_b8);
      if (!bVar1) break;
      __x = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_88);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(ioSubsetGlyphIDs,__x);
      std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_88);
    }
    __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(ioSubsetGlyphIDs);
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(ioSubsetGlyphIDs);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__last._M_current);
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&it);
  return glyphsSet._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
}

Assistant:

EStatusCode CFFEmbeddedFontWriter::AddDependentGlyphs(UIntVector& ioSubsetGlyphIDs)
{
	EStatusCode status = PDFHummus::eSuccess;
	UIntSet glyphsSet;
	UIntVector::iterator it = ioSubsetGlyphIDs.begin();
	bool hasCompositeGlyphs = false;

	for(;it != ioSubsetGlyphIDs.end() && PDFHummus::eSuccess == status; ++it)
	{
		bool localHasCompositeGlyphs;
		status = AddComponentGlyphs(*it,glyphsSet,localHasCompositeGlyphs);
		hasCompositeGlyphs |= localHasCompositeGlyphs;
	}

	if(hasCompositeGlyphs)
	{
		UIntSet::iterator itNewGlyphs;

		for(it = ioSubsetGlyphIDs.begin();it != ioSubsetGlyphIDs.end(); ++it)
			glyphsSet.insert(*it);

		ioSubsetGlyphIDs.clear();
		for(itNewGlyphs = glyphsSet.begin(); itNewGlyphs != glyphsSet.end(); ++itNewGlyphs)
			ioSubsetGlyphIDs.push_back(*itNewGlyphs);
		
		sort(ioSubsetGlyphIDs.begin(),ioSubsetGlyphIDs.end());
	}	
	return status;
}